

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void duckdb_je_extent_dalloc_wrapper(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata)

{
  int8_t *piVar1;
  extent_hooks_t *peVar2;
  bool bVar3;
  byte bVar4;
  _Bool _Var5;
  char cVar6;
  tsd_t *ptVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  long *in_FS_OFFSET;
  
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    if (!duckdb_je_opt_retain) {
LAB_01175429:
      if ((edata->e_bits & 0x10000) != 0) {
        duckdb_je_san_unguard_pages(tsdn,ehooks,edata,pac->emap,true,true);
      }
      duckdb_je_emap_deregister_boundary(tsdn,pac->emap,edata);
      pvVar8 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
      edata->e_addr = pvVar8;
      uVar10 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
      uVar9 = edata->e_bits;
      peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
      if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
        bVar3 = duckdb_je_ehooks_default_dalloc_impl(pvVar8,uVar10);
joined_r0x01175544:
        if (!bVar3) {
          duckdb_je_edata_cache_put(tsdn,pac->edata_cache,edata);
          return;
        }
      }
      else if (peVar2->dalloc != (extent_dalloc_t *)0x0) {
        ptVar7 = &tsdn->tsd;
        if ((tsdn == (tsdn_t *)0x0) &&
           (ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')
           ) {
          ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
        }
        ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
             ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01'
        ;
        if ((ptVar7->state).repr == '\0') {
          duckdb_je_tsd_slow_update(ptVar7);
        }
        bVar3 = (*peVar2->dalloc)(peVar2,pvVar8,uVar10,(_Bool)((byte)(uVar9 >> 0xd) & 1),ehooks->ind
                                 );
        ptVar7 = &tsdn->tsd;
        if ((tsdn == (tsdn_t *)0x0) &&
           (ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')
           ) {
          ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
        }
        piVar1 = &ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == '\0') {
          duckdb_je_tsd_slow_update(ptVar7);
        }
        goto joined_r0x01175544;
      }
      duckdb_je_emap_register_boundary(tsdn,pac->emap,edata,0xe8,false);
    }
  }
  else if (*(long *)((long)(ehooks->ptr).repr + 8) != 0) goto LAB_01175429;
  uVar9 = 0x8000;
  if ((edata->e_bits & 0x2000) == 0) goto LAB_011757a8;
  uVar10 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  pvVar8 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
    bVar4 = duckdb_je_ehooks_default_decommit_impl(pvVar8,0,uVar10);
LAB_01175668:
    edata->e_bits =
         (ulong)((byte)(edata->e_bits >> 0xd) & 1 & bVar4) << 0xd |
         edata->e_bits & 0xffffffffffffdfff;
    if (bVar4 == 0) goto LAB_011757a8;
  }
  else if (peVar2->decommit != (undefined1 *)0x0) {
    ptVar7 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')) {
      ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
    }
    ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar7->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar7);
    }
    bVar4 = (*(code *)peVar2->decommit)(peVar2,pvVar8,uVar10,0,uVar10,ehooks->ind);
    ptVar7 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')) {
      ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
    }
    piVar1 = &ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == '\0') {
      duckdb_je_tsd_slow_update(ptVar7);
    }
    goto LAB_01175668;
  }
  pvVar8 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  uVar10 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
    _Var5 = duckdb_je_ehooks_default_purge_forced_impl(pvVar8,0,uVar10);
    if (!_Var5) goto LAB_011757a8;
  }
  else if (peVar2->purge_forced != (undefined1 *)0x0) {
    ptVar7 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')) {
      ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
    }
    ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar7->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar7);
    }
    cVar6 = (*(code *)peVar2->purge_forced)(peVar2,pvVar8,uVar10,0,uVar10,ehooks->ind);
    ptVar7 = &tsdn->tsd;
    if ((tsdn == (tsdn_t *)0x0) &&
       (ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0')) {
      ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
    }
    piVar1 = &ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == '\0') {
      duckdb_je_tsd_slow_update(ptVar7);
    }
    if (cVar6 == '\0') goto LAB_011757a8;
  }
  if ((edata->e_bits & 0xe0000) != 0x40000) {
    pvVar8 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
    uVar10 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
    peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
    if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
      uVar9 = 0;
      duckdb_je_ehooks_default_purge_lazy_impl(pvVar8,0,uVar10);
      goto LAB_011757a8;
    }
    if (peVar2->purge_lazy != (undefined1 *)0x0) {
      ptVar7 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0'))
      {
        ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
      }
      ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      if ((ptVar7->state).repr == '\0') {
        duckdb_je_tsd_slow_update(ptVar7);
      }
      (*(code *)peVar2->purge_lazy)(peVar2,pvVar8,uVar10,0,uVar10,ehooks->ind);
      ptVar7 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90), *(char *)(*in_FS_OFFSET + -0x2758) != '\0'))
      {
        ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
      }
      piVar1 = &ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == '\0') {
        duckdb_je_tsd_slow_update(ptVar7);
      }
    }
  }
  uVar9 = 0;
LAB_011757a8:
  edata->e_bits = edata->e_bits & 0xffffffffffff7fff | uVar9;
  duckdb_je_extent_record(tsdn,pac,ehooks,&pac->ecache_retained,edata);
  return;
}

Assistant:

void
extent_dalloc_wrapper(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata) {
	assert(edata_pai_get(edata) == EXTENT_PAI_PAC);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* Avoid calling the default extent_dalloc unless have to. */
	if (!ehooks_dalloc_will_fail(ehooks)) {
		/* Remove guard pages for dalloc / unmap. */
		if (edata_guarded_get(edata)) {
			assert(ehooks_are_default(ehooks));
			san_unguard_pages_two_sided(tsdn, ehooks, edata,
			    pac->emap);
		}
		/*
		 * Deregister first to avoid a race with other allocating
		 * threads, and reregister if deallocation fails.
		 */
		extent_deregister(tsdn, pac, edata);
		if (!extent_dalloc_wrapper_try(tsdn, pac, ehooks, edata)) {
			return;
		}
		extent_reregister(tsdn, pac, edata);
	}

	/* Try to decommit; purge if that fails. */
	bool zeroed;
	if (!edata_committed_get(edata)) {
		zeroed = true;
	} else if (!extent_decommit_wrapper(tsdn, ehooks, edata, 0,
	    edata_size_get(edata))) {
		zeroed = true;
	} else if (!ehooks_purge_forced(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), 0, edata_size_get(edata))) {
		zeroed = true;
	} else if (edata_state_get(edata) == extent_state_muzzy ||
	    !ehooks_purge_lazy(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), 0, edata_size_get(edata))) {
		zeroed = false;
	} else {
		zeroed = false;
	}
	edata_zeroed_set(edata, zeroed);

	if (config_prof) {
		extent_gdump_sub(tsdn, edata);
	}

	extent_record(tsdn, pac, ehooks, &pac->ecache_retained, edata);
}